

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_2a6a20::WPKHDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,WPKHDescriptor *this,
          vector<CPubKey,_std::allocator<CPubKey>_> *keys,Span<const_CScript> param_2,
          FlatSigningProvider *out)

{
  long in_FS_OFFSET;
  CKeyID id;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_b8;
  undefined1 local_70;
  direct_or_indirect local_60;
  uint local_44;
  CKeyID local_3c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CPubKey::GetID(&local_3c,
                 (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                 super__Vector_impl_data._M_start);
  std::
  _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
  ::_M_emplace_unique<CKeyID&,CPubKey_const&>
            ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
              *)&out->pubkeys,&local_3c,
             (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
             super__Vector_impl_data._M_start);
  local_b8._M_first._M_storage._M_storage[0x10] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10];
  local_b8._M_first._M_storage._M_storage[0x11] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11];
  local_b8._M_first._M_storage._M_storage[0x12] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12];
  local_b8._M_first._M_storage._M_storage[0x13] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13];
  local_b8._M_first._M_storage._M_storage[0] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[0];
  local_b8._M_first._M_storage._M_storage[1] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[1];
  local_b8._M_first._M_storage._M_storage[2] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[2];
  local_b8._M_first._M_storage._M_storage[3] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[3];
  local_b8._M_first._M_storage._M_storage[4] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[4];
  local_b8._M_first._M_storage._M_storage[5] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[5];
  local_b8._M_first._M_storage._M_storage[6] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[6];
  local_b8._M_first._M_storage._M_storage[7] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[7];
  local_b8._M_first._M_storage._M_storage[8] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[8];
  local_b8._M_first._M_storage._M_storage[9] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[9];
  local_b8._M_first._M_storage._M_storage[10] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[10];
  local_b8._M_first._M_storage._M_storage[0xb] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb];
  local_b8._M_first._M_storage._M_storage[0xc] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc];
  local_b8._M_first._M_storage._M_storage[0xd] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd];
  local_b8._M_first._M_storage._M_storage[0xe] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe];
  local_b8._M_first._M_storage._M_storage[0xf] =
       local_3c.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf];
  local_70 = 5;
  GetScriptForDestination
            ((CScript *)&local_60.indirect_contents,(CTxDestination *)&local_b8._M_first);
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CScript,_std::allocator<CScript>_>::reserve(__return_storage_ptr__,1);
  std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
            (__return_storage_ptr__,(CScript *)&local_60.indirect_contents);
  if (0x1c < local_44) {
    free(local_60.indirect_contents.indirect);
    local_60.indirect_contents.indirect = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_b8._M_first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider& out) const override
    {
        CKeyID id = keys[0].GetID();
        out.pubkeys.emplace(id, keys[0]);
        return Vector(GetScriptForDestination(WitnessV0KeyHash(id)));
    }